

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_257,_true,_embree::avx2::VirtualCurveIntersectorK<8>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray,
              TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  char cVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong *puVar21;
  ulong *puVar22;
  ulong uVar23;
  vint4 ai;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  vint4 ai_3;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  vint4 ai_1;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 bi_1;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 bi_3;
  undefined1 auVar38 [16];
  vint4 bi;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  NodeRef stack [244];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar46._4_4_ = uVar1;
  auVar46._0_4_ = uVar1;
  auVar46._8_4_ = uVar1;
  auVar46._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar47._4_4_ = uVar1;
  auVar47._0_4_ = uVar1;
  auVar47._8_4_ = uVar1;
  auVar47._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar48._4_4_ = uVar1;
  auVar48._0_4_ = uVar1;
  auVar48._8_4_ = uVar1;
  auVar48._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar2 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar3 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x40);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar8 = fVar4 * 0.99999964;
  fVar9 = fVar5 * 0.99999964;
  fVar10 = fVar6 * 0.99999964;
  fVar4 = fVar4 * 1.0000004;
  fVar5 = fVar5 * 1.0000004;
  fVar6 = fVar6 * 1.0000004;
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar7 = (tray->tnear).field_0.i[k];
  auVar42._4_4_ = iVar7;
  auVar42._0_4_ = iVar7;
  auVar42._8_4_ = iVar7;
  auVar42._12_4_ = iVar7;
  iVar7 = (tray->tfar).field_0.i[k];
  auVar44._4_4_ = iVar7;
  auVar44._0_4_ = iVar7;
  auVar44._8_4_ = iVar7;
  auVar44._12_4_ = iVar7;
  puVar22 = local_7d0;
LAB_016128a9:
  puVar21 = puVar22;
  if (puVar21 == &local_7d8) {
LAB_01612ca4:
    return puVar21 != &local_7d8;
  }
  puVar22 = puVar21 + -1;
  uVar18 = puVar21[-1];
LAB_016128bd:
  if ((uVar18 & 0xf) == 0) {
    auVar25 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x20 + uVar19),auVar46);
    auVar24._0_4_ = fVar8 * auVar25._0_4_;
    auVar24._4_4_ = fVar8 * auVar25._4_4_;
    auVar24._8_4_ = fVar8 * auVar25._8_4_;
    auVar24._12_4_ = fVar8 * auVar25._12_4_;
    auVar25 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x20 + uVar23),auVar47);
    auVar28._0_4_ = fVar9 * auVar25._0_4_;
    auVar28._4_4_ = fVar9 * auVar25._4_4_;
    auVar28._8_4_ = fVar9 * auVar25._8_4_;
    auVar28._12_4_ = fVar9 * auVar25._12_4_;
    auVar25 = vmaxps_avx(auVar24,auVar28);
    auVar24 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x20 + uVar20),auVar48);
    auVar29._0_4_ = fVar10 * auVar24._0_4_;
    auVar29._4_4_ = fVar10 * auVar24._4_4_;
    auVar29._8_4_ = fVar10 * auVar24._8_4_;
    auVar29._12_4_ = fVar10 * auVar24._12_4_;
    auVar24 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x20 + (uVar19 ^ 0x10)),auVar46);
    auVar33._0_4_ = fVar4 * auVar24._0_4_;
    auVar33._4_4_ = fVar4 * auVar24._4_4_;
    auVar33._8_4_ = fVar4 * auVar24._8_4_;
    auVar33._12_4_ = fVar4 * auVar24._12_4_;
    auVar24 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x20 + (uVar23 ^ 0x10)),auVar47);
    auVar35._0_4_ = fVar5 * auVar24._0_4_;
    auVar35._4_4_ = fVar5 * auVar24._4_4_;
    auVar35._8_4_ = fVar5 * auVar24._8_4_;
    auVar35._12_4_ = fVar5 * auVar24._12_4_;
    auVar32 = vminps_avx(auVar33,auVar35);
    auVar24 = vsubps_avx(*(undefined1 (*) [16])(uVar18 + 0x20 + (uVar20 ^ 0x10)),auVar48);
    auVar36._0_4_ = fVar6 * auVar24._0_4_;
    auVar36._4_4_ = fVar6 * auVar24._4_4_;
    auVar36._8_4_ = fVar6 * auVar24._8_4_;
    auVar36._12_4_ = fVar6 * auVar24._12_4_;
    auVar24 = vmaxps_avx(auVar29,auVar42);
    auVar25 = vmaxps_avx(auVar25,auVar24);
    auVar24 = vminps_avx(auVar36,auVar44);
    auVar24 = vminps_avx(auVar32,auVar24);
    auVar25 = vcmpps_avx(auVar25,auVar24,2);
  }
  else {
    if ((int)(uVar18 & 0xf) != 2) {
      cVar14 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(uVar18 & 0xfffffffffffffff0) * 0x40 + 0x28))
                         (pre,ray,k,context);
      if (cVar14 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
        goto LAB_01612ca4;
      }
      goto LAB_016128a9;
    }
    uVar16 = uVar18 & 0xfffffffffffffff0;
    auVar25 = *(undefined1 (*) [16])(uVar16 + 0x80);
    auVar39._0_4_ = fVar3 * auVar25._0_4_;
    auVar39._4_4_ = fVar3 * auVar25._4_4_;
    auVar39._8_4_ = fVar3 * auVar25._8_4_;
    auVar39._12_4_ = fVar3 * auVar25._12_4_;
    auVar24 = *(undefined1 (*) [16])(uVar16 + 0x90);
    auVar41._0_4_ = fVar3 * auVar24._0_4_;
    auVar41._4_4_ = fVar3 * auVar24._4_4_;
    auVar41._8_4_ = fVar3 * auVar24._8_4_;
    auVar41._12_4_ = fVar3 * auVar24._12_4_;
    auVar43._0_4_ = fVar3 * *(float *)*(undefined1 (*) [16])(uVar16 + 0xa0);
    auVar43._4_4_ = fVar3 * *(float *)(uVar16 + 0xa4);
    auVar43._8_4_ = fVar3 * *(float *)(uVar16 + 0xa8);
    auVar43._12_4_ = fVar3 * *(float *)(uVar16 + 0xac);
    auVar12._4_4_ = uVar2;
    auVar12._0_4_ = uVar2;
    auVar12._8_4_ = uVar2;
    auVar12._12_4_ = uVar2;
    auVar32 = vfmadd231ps_fma(auVar39,auVar12,*(undefined1 (*) [16])(uVar16 + 0x50));
    auVar37 = vfmadd231ps_fma(auVar41,auVar12,*(undefined1 (*) [16])(uVar16 + 0x60));
    auVar13._4_4_ = uVar1;
    auVar13._0_4_ = uVar1;
    auVar13._8_4_ = uVar1;
    auVar13._12_4_ = uVar1;
    auVar39 = vfmadd231ps_fma(auVar32,auVar13,*(undefined1 (*) [16])(uVar16 + 0x20));
    auVar38 = vfmadd231ps_fma(auVar37,auVar13,*(undefined1 (*) [16])(uVar16 + 0x30));
    auVar45._8_4_ = 0x7fffffff;
    auVar45._0_8_ = 0x7fffffff7fffffff;
    auVar45._12_4_ = 0x7fffffff;
    auVar32 = vandps_avx(auVar45,auVar39);
    auVar30._8_4_ = 0x219392ef;
    auVar30._0_8_ = 0x219392ef219392ef;
    auVar30._12_4_ = 0x219392ef;
    auVar32 = vcmpps_avx(auVar32,auVar30,1);
    auVar37 = vblendvps_avx(auVar39,auVar30,auVar32);
    auVar32 = vandps_avx(auVar38,auVar45);
    auVar32 = vcmpps_avx(auVar32,auVar30,1);
    auVar39 = vblendvps_avx(auVar38,auVar30,auVar32);
    auVar32 = vfmadd231ps_fma(auVar43,auVar12,*(undefined1 (*) [16])(uVar16 + 0x70));
    auVar38 = vfmadd231ps_fma(auVar32,auVar13,*(undefined1 (*) [16])(uVar16 + 0x40));
    auVar32 = vandps_avx(auVar38,auVar45);
    auVar32 = vcmpps_avx(auVar32,auVar30,1);
    auVar32 = vblendvps_avx(auVar38,auVar30,auVar32);
    auVar38 = vrcpps_avx(auVar37);
    auVar26._8_4_ = 0x3f800000;
    auVar26._0_8_ = 0x3f8000003f800000;
    auVar26._12_4_ = 0x3f800000;
    auVar37 = vfnmadd213ps_fma(auVar37,auVar38,auVar26);
    auVar38 = vfmadd132ps_fma(auVar37,auVar38,auVar38);
    auVar37 = vrcpps_avx(auVar39);
    auVar39 = vfnmadd213ps_fma(auVar39,auVar37,auVar26);
    auVar39 = vfmadd132ps_fma(auVar39,auVar37,auVar37);
    auVar37 = vrcpps_avx(auVar32);
    auVar32 = vfnmadd213ps_fma(auVar32,auVar37,auVar26);
    auVar32 = vfmadd132ps_fma(auVar32,auVar37,auVar37);
    auVar25 = vfmadd213ps_fma(auVar25,auVar48,*(undefined1 (*) [16])(uVar16 + 0xb0));
    auVar37 = vfmadd231ps_fma(auVar25,auVar47,*(undefined1 (*) [16])(uVar16 + 0x50));
    auVar25 = vfmadd213ps_fma(auVar24,auVar48,*(undefined1 (*) [16])(uVar16 + 0xc0));
    auVar24 = vfmadd231ps_fma(auVar25,auVar47,*(undefined1 (*) [16])(uVar16 + 0x60));
    auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xa0),auVar48,
                              *(undefined1 (*) [16])(uVar16 + 0xd0));
    auVar25 = vfmadd231ps_fma(auVar25,auVar47,*(undefined1 (*) [16])(uVar16 + 0x70));
    auVar37 = vfmadd231ps_fma(auVar37,auVar46,*(undefined1 (*) [16])(uVar16 + 0x20));
    auVar34._0_4_ = auVar37._0_4_ * -auVar38._0_4_;
    auVar34._4_4_ = auVar37._4_4_ * -auVar38._4_4_;
    auVar34._8_4_ = auVar37._8_4_ * -auVar38._8_4_;
    auVar34._12_4_ = auVar37._12_4_ * -auVar38._12_4_;
    auVar24 = vfmadd231ps_fma(auVar24,auVar46,*(undefined1 (*) [16])(uVar16 + 0x30));
    auVar31._0_4_ = auVar24._0_4_ * -auVar39._0_4_;
    auVar31._4_4_ = auVar24._4_4_ * -auVar39._4_4_;
    auVar31._8_4_ = auVar24._8_4_ * -auVar39._8_4_;
    auVar31._12_4_ = auVar24._12_4_ * -auVar39._12_4_;
    auVar25 = vfmadd231ps_fma(auVar25,auVar46,*(undefined1 (*) [16])(uVar16 + 0x40));
    auVar27._0_4_ = auVar25._0_4_ * -auVar32._0_4_;
    auVar27._4_4_ = auVar25._4_4_ * -auVar32._4_4_;
    auVar27._8_4_ = auVar25._8_4_ * -auVar32._8_4_;
    auVar27._12_4_ = auVar25._12_4_ * -auVar32._12_4_;
    auVar37._0_4_ = auVar38._0_4_ + auVar34._0_4_;
    auVar37._4_4_ = auVar38._4_4_ + auVar34._4_4_;
    auVar37._8_4_ = auVar38._8_4_ + auVar34._8_4_;
    auVar37._12_4_ = auVar38._12_4_ + auVar34._12_4_;
    auVar38._0_4_ = auVar39._0_4_ + auVar31._0_4_;
    auVar38._4_4_ = auVar39._4_4_ + auVar31._4_4_;
    auVar38._8_4_ = auVar39._8_4_ + auVar31._8_4_;
    auVar38._12_4_ = auVar39._12_4_ + auVar31._12_4_;
    auVar40._0_4_ = auVar32._0_4_ + auVar27._0_4_;
    auVar40._4_4_ = auVar32._4_4_ + auVar27._4_4_;
    auVar40._8_4_ = auVar32._8_4_ + auVar27._8_4_;
    auVar40._12_4_ = auVar32._12_4_ + auVar27._12_4_;
    auVar25 = vpminsd_avx(auVar31,auVar38);
    auVar24 = vpminsd_avx(auVar27,auVar40);
    auVar25 = vmaxps_avx(auVar25,auVar24);
    auVar39 = vpminsd_avx(auVar34,auVar37);
    auVar37 = vpmaxsd_avx(auVar34,auVar37);
    auVar24 = vpmaxsd_avx(auVar31,auVar38);
    auVar32 = vpmaxsd_avx(auVar27,auVar40);
    auVar32 = vminps_avx(auVar24,auVar32);
    auVar24 = vmaxps_avx(auVar42,auVar39);
    auVar25 = vmaxps_avx(auVar24,auVar25);
    auVar24 = vminps_avx(auVar44,auVar37);
    auVar24 = vminps_avx(auVar24,auVar32);
    auVar32._0_4_ = auVar25._0_4_ * 0.99999964;
    auVar32._4_4_ = auVar25._4_4_ * 0.99999964;
    auVar32._8_4_ = auVar25._8_4_ * 0.99999964;
    auVar32._12_4_ = auVar25._12_4_ * 0.99999964;
    auVar25._0_4_ = auVar24._0_4_ * 1.0000004;
    auVar25._4_4_ = auVar24._4_4_ * 1.0000004;
    auVar25._8_4_ = auVar24._8_4_ * 1.0000004;
    auVar25._12_4_ = auVar24._12_4_ * 1.0000004;
    auVar25 = vcmpps_avx(auVar32,auVar25,2);
  }
  auVar25 = vpslld_avx(auVar25,0x1f);
  uVar15 = vmovmskps_avx(auVar25);
  if (uVar15 == 0) goto LAB_016128a9;
  uVar15 = uVar15 & 0xff;
  uVar16 = uVar18 & 0xfffffffffffffff0;
  lVar11 = 0;
  for (uVar18 = (ulong)uVar15; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
    lVar11 = lVar11 + 1;
  }
  uVar18 = *(ulong *)(uVar16 + lVar11 * 8);
  uVar15 = uVar15 - 1 & uVar15;
  uVar17 = (ulong)uVar15;
  if (uVar15 != 0) {
    do {
      *puVar22 = uVar18;
      puVar22 = puVar22 + 1;
      lVar11 = 0;
      for (uVar18 = uVar17; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
        lVar11 = lVar11 + 1;
      }
      uVar17 = uVar17 - 1 & uVar17;
      uVar18 = *(ulong *)(uVar16 + lVar11 * 8);
    } while (uVar17 != 0);
  }
  goto LAB_016128bd;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }